

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

ssize_t __thiscall
kj::ReadableDirectory::readlink(ReadableDirectory *this,char *__path,char *__buf,size_t __len)

{
  char (*params) [2];
  undefined8 unaff_R12;
  undefined8 uVar1;
  undefined8 unaff_R15;
  Fault f;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_70;
  NullableValue<kj::String> _p570;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)__buf;
  path_local.parts.size_ = __len;
  (**(code **)(*(long *)__path + 0x60))(&f);
  _p570.isSet = (bool)(char)f.exception;
  uVar1 = &f;
  if ((char)f.exception == '\x01') {
    _p570.field_1.value.content.ptr = local_70.value.content.ptr;
    _p570.field_1.value.content.size_ = local_70.value.content.size_;
    unaff_R12 = local_70.value.content.ptr;
    uVar1 = local_70.value.content.size_;
    unaff_R15 = local_70.value.content.disposer;
  }
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f);
  if ((char)f.exception == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x23d,FAILED,(char *)0x0,"\"not a symlink\", path",(char (*) [14])"not a symlink",
               &path_local);
    kj::_::Debug::Fault::~Fault(&f);
    str<char_const(&)[2]>((String *)this,(kj *)0x44c3f5,params);
  }
  else {
    (this->super_FsNode)._vptr_FsNode = (_func_int **)unaff_R12;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)uVar1;
    this[2].super_FsNode._vptr_FsNode = (_func_int **)unaff_R15;
    _p570.field_1.value.content.ptr = (char *)0x0;
    _p570.field_1.value.content.size_ = 0;
  }
  kj::_::NullableValue<kj::String>::~NullableValue(&_p570);
  return (ssize_t)this;
}

Assistant:

String ReadableDirectory::readlink(PathPtr path) const {
  KJ_IF_SOME(p, tryReadlink(path)) {
    return kj::mv(p);
  } else {
    KJ_FAIL_REQUIRE("not a symlink", path) { break; }